

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O3

AffineSpace3fa * embree::fromQuaternionDecomposition(RTCQuaternionDecomposition *qdc)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  AffineSpace3fa *in_RDI;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  uVar3 = qdc->translation_y;
  uVar4 = qdc->translation_z;
  fVar1 = qdc->translation_x;
  fVar5 = qdc->shift_z;
  fVar6 = qdc->quaternion_r;
  fVar18 = qdc->quaternion_i;
  fVar19 = qdc->quaternion_j;
  fVar2 = qdc->quaternion_k;
  fVar21 = fVar18 * fVar19 + fVar6 * fVar2;
  fVar7 = fVar18 * fVar19 - fVar6 * fVar2;
  fVar8 = fVar6 * fVar6 + fVar18 * fVar18 + -fVar19 * fVar19 + -fVar2 * fVar2;
  fVar23 = fVar6 * fVar6 - fVar18 * fVar18;
  fVar20 = fVar19 * fVar19 + fVar23 + -fVar2 * fVar2;
  fVar24 = fVar18 * fVar2 - fVar6 * fVar19;
  fVar13 = fVar6 * fVar19 + fVar18 * fVar2;
  fVar22 = fVar19 * fVar2 + fVar18 * fVar6;
  fVar18 = fVar19 * fVar2 - fVar18 * fVar6;
  fVar21 = fVar21 + fVar21;
  fVar24 = fVar24 + fVar24;
  fVar19 = fVar2 * fVar2 + fVar23 + -fVar19 * fVar19;
  fVar9 = fVar8 * 1.0 + fVar21 * 0.0 + fVar24 * 0.0;
  fVar10 = fVar8 * 0.0 + fVar21 * 1.0 + fVar24 * 0.0;
  fVar11 = fVar8 * 0.0 + fVar21 * 0.0 + fVar24 * 1.0;
  fVar12 = fVar8 * 0.0 + fVar21 * 0.0 + fVar24 * 0.0;
  fVar22 = fVar22 + fVar22;
  fVar7 = fVar7 + fVar7;
  fVar21 = fVar7 * 1.0 + fVar20 * 0.0 + fVar22 * 0.0;
  fVar23 = fVar7 * 0.0 + fVar20 * 1.0 + fVar22 * 0.0;
  fVar24 = fVar7 * 0.0 + fVar20 * 0.0 + fVar22 * 1.0;
  fVar22 = fVar7 * 0.0 + fVar20 * 0.0 + fVar22 * 0.0;
  fVar18 = fVar18 + fVar18;
  fVar2 = qdc->scale_x;
  fVar13 = fVar13 + fVar13;
  fVar6 = qdc->scale_z;
  fVar14 = fVar13 * 1.0 + fVar18 * 0.0 + fVar19 * 0.0;
  fVar15 = fVar13 * 0.0 + fVar18 * 1.0 + fVar19 * 0.0;
  fVar16 = fVar13 * 0.0 + fVar18 * 0.0 + fVar19 * 1.0;
  fVar17 = fVar13 * 0.0 + fVar18 * 0.0 + fVar19 * 0.0;
  fVar18 = qdc->scale_y;
  fVar19 = qdc->skew_xy;
  fVar7 = qdc->skew_yz;
  fVar8 = qdc->skew_xz;
  fVar13 = qdc->shift_y;
  fVar20 = qdc->shift_x;
  (in_RDI->l).vx.field_0.m128[0] = fVar2 * fVar9 + fVar21 * 0.0 + fVar14 * 0.0;
  (in_RDI->l).vx.field_0.m128[1] = fVar2 * fVar10 + fVar23 * 0.0 + fVar15 * 0.0;
  (in_RDI->l).vx.field_0.m128[2] = fVar2 * fVar11 + fVar24 * 0.0 + fVar16 * 0.0;
  (in_RDI->l).vx.field_0.m128[3] = fVar2 * fVar12 + fVar22 * 0.0 + fVar17 * 0.0;
  (in_RDI->l).vy.field_0.m128[0] = fVar19 * fVar9 + fVar18 * fVar21 + fVar14 * 0.0;
  (in_RDI->l).vy.field_0.m128[1] = fVar19 * fVar10 + fVar18 * fVar23 + fVar15 * 0.0;
  (in_RDI->l).vy.field_0.m128[2] = fVar19 * fVar11 + fVar18 * fVar24 + fVar16 * 0.0;
  (in_RDI->l).vy.field_0.m128[3] = fVar19 * fVar12 + fVar18 * fVar22 + fVar17 * 0.0;
  (in_RDI->l).vz.field_0.m128[0] = fVar8 * fVar9 + fVar7 * fVar21 + fVar6 * fVar14;
  (in_RDI->l).vz.field_0.m128[1] = fVar8 * fVar10 + fVar7 * fVar23 + fVar6 * fVar15;
  (in_RDI->l).vz.field_0.m128[2] = fVar8 * fVar11 + fVar7 * fVar24 + fVar6 * fVar16;
  (in_RDI->l).vz.field_0.m128[3] = fVar8 * fVar12 + fVar7 * fVar22 + fVar6 * fVar17;
  (in_RDI->p).field_0.m128[0] = fVar20 * fVar9 + fVar13 * fVar21 + fVar5 * fVar14 + fVar1 + 0.0;
  (in_RDI->p).field_0.m128[1] =
       fVar20 * fVar10 + fVar13 * fVar23 + fVar5 * fVar15 + (float)uVar3 + 0.0;
  (in_RDI->p).field_0.m128[2] =
       fVar20 * fVar11 + fVar13 * fVar24 + fVar5 * fVar16 + (float)uVar4 + 0.0;
  (in_RDI->p).field_0.m128[3] = fVar20 * fVar12 + fVar13 * fVar22 + fVar5 * fVar17 + 0.0;
  return in_RDI;
}

Assistant:

AffineSpace3fa fromQuaternionDecomposition(const RTCQuaternionDecomposition& qdc)
{
  AffineSpace3fa T = AffineSpace3fa::scale(Vec3fa(1.f, 1.f, 1.f));
  T.p = Vec3fa(qdc.translation_x, qdc.translation_y, qdc.translation_z);

  AffineSpace3fa S = AffineSpace3fa::scale(Vec3fa(1.f, 1.f, 1.f));
  S.l.vx.x = qdc.scale_x; S.l.vy.x = qdc.skew_xy; S.l.vz.x = qdc.skew_xz; S.p.x = qdc.shift_x;
                          S.l.vy.y = qdc.scale_y; S.l.vz.y = qdc.skew_yz; S.p.y = qdc.shift_y;
                                                  S.l.vz.z = qdc.scale_z; S.p.z = qdc.shift_z;

  Quaternion3f q = Quaternion3f(Vec4f(
    qdc.quaternion_r, qdc.quaternion_i, qdc.quaternion_j, qdc.quaternion_k));

  AffineSpace3fa R = AffineSpace3fa(LinearSpace3fa(q));
  return T * R * S;
}